

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<unsigned_int> * __thiscall
vkb::Device::get_queue_index
          (Result<unsigned_int> *__return_storage_ptr__,Device *this,QueueType type)

{
  error_code error_code;
  error_code error_code_00;
  error_code error_code_01;
  error_code error_code_02;
  error_code error_code_03;
  error_code local_70;
  error_code local_60;
  error_code local_50;
  error_code local_40;
  error_code local_30;
  uint local_20;
  QueueType local_1c;
  uint32_t index;
  QueueType type_local;
  Device *this_local;
  
  local_20 = 0xffffffff;
  local_1c = type;
  _index = this;
  this_local = (Device *)__return_storage_ptr__;
  switch(type) {
  case present:
    local_20 = detail::get_present_queue_index
                         ((this->physical_device).physical_device,this->surface,
                          &this->queue_families);
    if (local_20 == 0xffffffff) {
      std::error_code::error_code<vkb::QueueError,void>(&local_30,present_unavailable);
      error_code._4_4_ = 0;
      error_code._M_value = local_30._M_value;
      error_code._M_cat = local_30._M_cat;
      Result<unsigned_int>::Result(__return_storage_ptr__,error_code,VK_SUCCESS);
      return __return_storage_ptr__;
    }
    break;
  case graphics:
    local_20 = detail::get_first_queue_index(&this->queue_families,1);
    if (local_20 == 0xffffffff) {
      std::error_code::error_code<vkb::QueueError,void>(&local_40,graphics_unavailable);
      error_code_00._4_4_ = 0;
      error_code_00._M_value = local_40._M_value;
      error_code_00._M_cat = local_40._M_cat;
      Result<unsigned_int>::Result(__return_storage_ptr__,error_code_00,VK_SUCCESS);
      return __return_storage_ptr__;
    }
    break;
  case compute:
    local_20 = detail::get_separate_queue_index(&this->queue_families,2,4);
    if (local_20 == 0xffffffff) {
      std::error_code::error_code<vkb::QueueError,void>(&local_50,compute_unavailable);
      error_code_01._4_4_ = 0;
      error_code_01._M_value = local_50._M_value;
      error_code_01._M_cat = local_50._M_cat;
      Result<unsigned_int>::Result(__return_storage_ptr__,error_code_01,VK_SUCCESS);
      return __return_storage_ptr__;
    }
    break;
  case transfer:
    local_20 = detail::get_separate_queue_index(&this->queue_families,4,2);
    if (local_20 == 0xffffffff) {
      std::error_code::error_code<vkb::QueueError,void>(&local_60,transfer_unavailable);
      error_code_02._4_4_ = 0;
      error_code_02._M_value = local_60._M_value;
      error_code_02._M_cat = local_60._M_cat;
      Result<unsigned_int>::Result(__return_storage_ptr__,error_code_02,VK_SUCCESS);
      return __return_storage_ptr__;
    }
    break;
  default:
    std::error_code::error_code<vkb::QueueError,void>(&local_70,invalid_queue_family_index);
    error_code_03._4_4_ = 0;
    error_code_03._M_value = local_70._M_value;
    error_code_03._M_cat = local_70._M_cat;
    Result<unsigned_int>::Result(__return_storage_ptr__,error_code_03,VK_SUCCESS);
    return __return_storage_ptr__;
  }
  Result<unsigned_int>::Result(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> Device::get_queue_index(QueueType type) const {
    uint32_t index = detail::QUEUE_INDEX_MAX_VALUE;
    switch (type) {
        case QueueType::present:
            index = detail::get_present_queue_index(physical_device.physical_device, surface, queue_families);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::present_unavailable };
            break;
        case QueueType::graphics:
            index = detail::get_first_queue_index(queue_families, VK_QUEUE_GRAPHICS_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::graphics_unavailable };
            break;
        case QueueType::compute:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::compute_unavailable };
            break;
        case QueueType::transfer:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::transfer_unavailable };
            break;
        default:
            return Result<uint32_t>{ QueueError::invalid_queue_family_index };
    }
    return index;
}